

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O2

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparate
          (BlendMaskStateMachine *this,GLenum src_rgb,GLenum dst_rgb,GLenum src_a,GLenum dst_a)

{
  pointer pBVar1;
  pointer pBVar2;
  uint uVar3;
  ulong uVar4;
  
  (*this->gl->blendFuncSeparate)(src_rgb,dst_rgb,src_a,dst_a);
  pBVar1 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < (ulong)((long)pBVar2 - (long)pBVar1 >> 5);
      uVar3 = uVar3 + 1) {
    pBVar1[uVar4].func_src_rgb = src_rgb;
    pBVar1[uVar4].func_src_a = src_a;
    pBVar1[uVar4].func_dst_rgb = dst_rgb;
    pBVar1[uVar4].func_dst_a = dst_a;
  }
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparate(glw::GLenum src_rgb, glw::GLenum dst_rgb,
																		 glw::GLenum src_a, glw::GLenum dst_a)
{
	// all draw buffers
	gl.blendFuncSeparate(src_rgb, dst_rgb, src_a, dst_a);
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		state[i].func_src_rgb = src_rgb;
		state[i].func_src_a   = src_a;
		state[i].func_dst_rgb = dst_rgb;
		state[i].func_dst_a   = dst_a;
	}
}